

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

string * google::MungeLine(string *__return_storage_ptr__,string *line)

{
  _Alloc_hider _Var1;
  void *pvVar2;
  long lVar3;
  istream *piVar4;
  string *psVar5;
  ostream *poVar6;
  string rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string before;
  string thread_lineinfo;
  string logcode_date;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string time;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)line,_S_in);
  before._M_dataplus._M_p = (pointer)&before.field_2;
  before._M_string_length = 0;
  logcode_date._M_dataplus._M_p = (pointer)&logcode_date.field_2;
  logcode_date._M_string_length = 0;
  logcode_date.field_2._M_local_buf[0] = '\0';
  time._M_dataplus._M_p = (pointer)&time.field_2;
  time._M_string_length = 0;
  before.field_2._M_local_buf[0] = '\0';
  time.field_2._M_local_buf[0] = '\0';
  thread_lineinfo._M_dataplus._M_p = (pointer)&thread_lineinfo.field_2;
  thread_lineinfo._M_string_length = 0;
  thread_lineinfo.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&iss,(string *)&logcode_date);
  do {
    _Var1._M_p = logcode_date._M_dataplus._M_p;
    if (logcode_date._M_string_length == 5) {
      pvVar2 = memchr("IWEF",(int)*logcode_date._M_dataplus._M_p,5);
      if (pvVar2 != (void *)0x0) {
        lVar3 = 0;
        do {
          if (lVar3 == 4) {
            if (before._M_string_length != 0) {
              std::__cxx11::string::append((char *)&before);
            }
            std::operator>>((istream *)&iss,(string *)&time);
            std::operator>>((istream *)&iss,(string *)&thread_lineinfo);
            if (thread_lineinfo._M_string_length == 0) {
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&rest,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                         ,0x1a1);
              poVar6 = LogMessage::stream((LogMessage *)&rest);
              std::operator<<(poVar6,"Check failed: !thread_lineinfo.empty() ");
            }
            else {
              if (thread_lineinfo._M_dataplus._M_p[thread_lineinfo._M_string_length - 1] != ']') {
                rest._M_dataplus._M_p = (pointer)&rest.field_2;
                rest._M_string_length = 0;
                rest.field_2._M_local_buf[0] = '\0';
                std::operator>>((istream *)&iss,(string *)&rest);
                if (rest._M_string_length == 0) {
                  LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_2b8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                             ,0x1a6);
                  poVar6 = LogMessage::stream((LogMessage *)&local_2b8);
                  std::operator<<(poVar6,"Check failed: !tmp.empty() ");
LAB_00119e11:
                  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b8);
                }
                local_2b8._M_dataplus._M_p._0_1_ = 0x5d;
                local_230._M_dataplus._M_p._0_1_ = rest._M_dataplus._M_p[rest._M_string_length - 1];
                psVar5 = Check_EQImpl<char,char>
                                   ((char *)&local_2b8,(char *)&local_230,
                                    "\']\' == tmp[tmp.size() - 1]");
                if (psVar5 != (string *)0x0) {
                  local_230._M_dataplus._M_p = (pointer)psVar5;
                  LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_2b8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                             ,0x1a7,(CheckOpString *)&local_230);
                  LogMessage::stream((LogMessage *)&local_2b8);
                  goto LAB_00119e11;
                }
                std::operator+(&local_2b8,"THREADID ",&rest);
                std::__cxx11::string::operator=((string *)&thread_lineinfo,(string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&rest);
              }
              local_2b8._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::find((char)&thread_lineinfo,0x3a);
              rest._M_dataplus._M_p = (pointer)0xffffffffffffffff;
              psVar5 = Check_NEImpl<unsigned_long,unsigned_long>
                                 ((unsigned_long *)&rest,(unsigned_long *)&local_2b8,
                                  "string::npos != index");
              if (psVar5 == (string *)0x0) {
                std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&thread_lineinfo);
                std::operator+(&rest,&local_2b8,"LINE]");
                std::__cxx11::string::operator=((string *)&thread_lineinfo,(string *)&rest);
                std::__cxx11::string::~string((string *)&rest);
                std::__cxx11::string::~string((string *)&local_2b8);
                rest._M_dataplus._M_p = (pointer)&rest.field_2;
                rest._M_string_length = 0;
                rest.field_2._M_local_buf[0] = '\0';
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&iss,(string *)&rest);
                std::operator+(&local_1f0,&before,*logcode_date._M_dataplus._M_p);
                std::operator+(&local_230,&local_1f0,"DATE TIME__ ");
                std::operator+(&local_2b8,&local_230,&thread_lineinfo);
                MungeLine(&local_210,&rest);
                std::operator+(__return_storage_ptr__,&local_2b8,&local_210);
                std::__cxx11::string::~string((string *)&local_210);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_230);
                std::__cxx11::string::~string((string *)&local_1f0);
                std::__cxx11::string::~string((string *)&rest);
                goto LAB_00119c73;
              }
              local_2b8._M_dataplus._M_p = (pointer)psVar5;
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&rest,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                         ,0x1ab,(CheckOpString *)&local_2b8);
              LogMessage::stream((LogMessage *)&rest);
            }
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&rest);
          }
          if ((9 < (int)_Var1._M_p[lVar3 + 1] - 0x30U) && (_Var1._M_p[lVar3 + 1] != "DATE"[lVar3]))
          break;
          lVar3 = lVar3 + 1;
        } while( true );
      }
    }
    std::operator+(&rest," ",&logcode_date);
    std::__cxx11::string::append((string *)&before);
    std::__cxx11::string::~string((string *)&rest);
    piVar4 = std::operator>>((istream *)&iss,(string *)&logcode_date);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)before._M_dataplus._M_p == &before.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(before.field_2._M_allocated_capacity._1_7_,before.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = before.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = before._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(before.field_2._M_allocated_capacity._1_7_,before.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = before._M_string_length;
      before._M_string_length = 0;
      before.field_2._M_local_buf[0] = '\0';
      before._M_dataplus._M_p = (pointer)&before.field_2;
LAB_00119c73:
      std::__cxx11::string::~string((string *)&thread_lineinfo);
      std::__cxx11::string::~string((string *)&time);
      std::__cxx11::string::~string((string *)&logcode_date);
      std::__cxx11::string::~string((string *)&before);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static inline string MungeLine(const string& line) {
  std::istringstream iss(line);
  string before, logcode_date, time, thread_lineinfo;
  iss >> logcode_date;
  while (!IsLoggingPrefix(logcode_date)) {
    before += " " + logcode_date;
    if (!(iss >> logcode_date)) {
      // We cannot find the header of log output.
      return before;
    }
  }
  if (!before.empty()) before += " ";
  iss >> time;
  iss >> thread_lineinfo;
  CHECK(!thread_lineinfo.empty());
  if (thread_lineinfo[thread_lineinfo.size() - 1] != ']') {
    // We found thread ID.
    string tmp;
    iss >> tmp;
    CHECK(!tmp.empty());
    CHECK_EQ(']', tmp[tmp.size() - 1]);
    thread_lineinfo = "THREADID " + tmp;
  }
  size_t index = thread_lineinfo.find(':');
  CHECK_NE(string::npos, index);
  thread_lineinfo = thread_lineinfo.substr(0, index+1) + "LINE]";
  string rest;
  std::getline(iss, rest);
  return (before + logcode_date[0] + "DATE TIME__ " + thread_lineinfo +
          MungeLine(rest));
}